

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O0

Vec_Int_t * Gia_ManComputeSlacks(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Gia_Obj_t *pGVar4;
  bool bVar5;
  Vec_Int_t *vSlacks;
  Vec_Int_t *vLevelR;
  int nLevels;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManLevelNum(p);
  p_00 = Gia_ManReverseLevel(p);
  iVar2 = Gia_ManObjNum(p);
  p_01 = Vec_IntAlloc(iVar2);
  vLevelR._4_4_ = 0;
  while( true ) {
    bVar5 = false;
    if (vLevelR._4_4_ < p->nObjs) {
      pGVar4 = Gia_ManObj(p,vLevelR._4_4_);
      bVar5 = pGVar4 != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    iVar2 = Gia_ObjLevelId(p,vLevelR._4_4_);
    iVar3 = Vec_IntEntry(p_00,vLevelR._4_4_);
    Vec_IntPush(p_01,(iVar1 - iVar2) - iVar3);
    vLevelR._4_4_ = vLevelR._4_4_ + 1;
  }
  iVar1 = Vec_IntSize(p_01);
  iVar2 = Gia_ManObjNum(p);
  if (iVar1 == iVar2) {
    Vec_IntFree(p_00);
    return p_01;
  }
  __assert_fail("Vec_IntSize(vSlacks) == Gia_ManObjNum(p)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaUtil.c"
                ,0x29f,"Vec_Int_t *Gia_ManComputeSlacks(Gia_Man_t *)");
}

Assistant:

Vec_Int_t * Gia_ManComputeSlacks( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i, nLevels = Gia_ManLevelNum( p );
    Vec_Int_t * vLevelR = Gia_ManReverseLevel( p );
    Vec_Int_t * vSlacks = Vec_IntAlloc( Gia_ManObjNum(p) );
    Gia_ManForEachObj( p, pObj, i )
        Vec_IntPush( vSlacks, nLevels - Gia_ObjLevelId(p, i) - Vec_IntEntry(vLevelR, i) );
    assert( Vec_IntSize(vSlacks) == Gia_ManObjNum(p) );
    Vec_IntFree( vLevelR );
    return vSlacks;
}